

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManDemiterToDual(Gia_Man_t *p)

{
  uint nNodes;
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  Vec_Int_t *__ptr;
  Vec_Int_t *vNodes;
  int *piVar6;
  Gia_Man_t *p_00;
  size_t sVar7;
  char *pcVar8;
  Vec_Int_t *pVVar9;
  Gia_Obj_t *pGVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  
  __ptr = Gia_ManCollectTopXors(p);
  if (__ptr == (Vec_Int_t *)0x0) {
    puts("Cannot demiter because the top-most gate is an AND-gate.");
    p_00 = (Gia_Man_t *)0x0;
  }
  else {
    nNodes = __ptr->nSize;
    if ((nNodes & 1) != 0) {
      __assert_fail("Vec_IntSize(vOrder) % 2 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                    ,0x11a4,"Gia_Man_t *Gia_ManDemiterToDual(Gia_Man_t *)");
    }
    iVar1 = p->nObjs;
    vNodes = (Vec_Int_t *)malloc(0x10);
    iVar11 = 0x10;
    if (0xe < iVar1 - 1U) {
      iVar11 = iVar1;
    }
    vNodes->nSize = 0;
    vNodes->nCap = iVar11;
    if (iVar11 == 0) {
      piVar6 = (int *)0x0;
    }
    else {
      piVar6 = (int *)malloc((long)iVar11 << 2);
    }
    vNodes->pArray = piVar6;
    Gia_ManIncrementTravId(p);
    piVar6 = __ptr->pArray;
    pcVar8 = (char *)0x0;
    Gia_ManCollectAnds(p,piVar6,nNodes,vNodes,(Vec_Int_t *)0x0);
    p_00 = Gia_ManStart(vNodes->nSize + p->vCis->nSize + nNodes + 1);
    pcVar2 = p->pName;
    if (pcVar2 != (char *)0x0) {
      sVar7 = strlen(pcVar2);
      pcVar8 = (char *)malloc(sVar7 + 1);
      strcpy(pcVar8,pcVar2);
    }
    p_00->pName = pcVar8;
    pcVar2 = p->pSpec;
    if (pcVar2 == (char *)0x0) {
      pcVar8 = (char *)0x0;
    }
    else {
      sVar7 = strlen(pcVar2);
      pcVar8 = (char *)malloc(sVar7 + 1);
      strcpy(pcVar8,pcVar2);
    }
    p_00->pSpec = pcVar8;
    p->pObjs->Value = 0;
    pVVar9 = p->vCis;
    if (0 < pVVar9->nSize) {
      lVar13 = 0;
      do {
        iVar1 = pVVar9->pArray[lVar13];
        if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_001f5776;
        pGVar3 = p->pObjs;
        if (pGVar3 == (Gia_Obj_t *)0x0) break;
        pGVar10 = Gia_ManAppendObj(p_00);
        uVar12 = *(ulong *)pGVar10;
        *(ulong *)pGVar10 = uVar12 | 0x9fffffff;
        *(ulong *)pGVar10 =
             uVar12 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar4 = p_00->pObjs;
        if ((pGVar10 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar10)) {
LAB_001f5795:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) * -0x55555555);
        pGVar4 = p_00->pObjs;
        if ((pGVar10 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar10)) goto LAB_001f5795;
        pGVar3[iVar1].Value = (int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) * 0x55555556;
        lVar13 = lVar13 + 1;
        pVVar9 = p->vCis;
      } while (lVar13 < pVVar9->nSize);
    }
    if (0 < vNodes->nSize) {
      lVar13 = 0;
      do {
        iVar1 = vNodes->pArray[lVar13];
        if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_001f5776;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar3 = p->pObjs + iVar1;
        uVar12 = *(ulong *)pGVar3;
        if ((int)pGVar3[-(ulong)((uint)uVar12 & 0x1fffffff)].Value < 0) goto LAB_001f57b4;
        uVar5 = (uint)(uVar12 >> 0x20);
        if ((int)pGVar3[-(ulong)(uVar5 & 0x1fffffff)].Value < 0) goto LAB_001f57b4;
        uVar5 = Gia_ManAppendAnd(p_00,(uint)(uVar12 >> 0x1d) & 1 ^
                                      pGVar3[-(ulong)((uint)uVar12 & 0x1fffffff)].Value,
                                 pGVar3[-(ulong)(uVar5 & 0x1fffffff)].Value ^ uVar5 >> 0x1d & 1);
        pGVar3->Value = uVar5;
        lVar13 = lVar13 + 1;
      } while (lVar13 < vNodes->nSize);
    }
    if (p->vCos->nSize < 1) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar1 = *p->vCos->pArray;
    if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_001f5776:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pGVar3 = p->pObjs + iVar1;
    if (pGVar3 + -(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff) == p->pObjs) {
      Gia_ManAppendCo(p_00,0);
      Gia_ManAppendCo(p_00,*(uint *)pGVar3 >> 0x1d & 1);
    }
    else {
      Gia_ManSetPhase(p);
      if (0 < (int)nNodes) {
        uVar12 = 0;
        do {
          lVar13 = (long)piVar6[uVar12];
          if ((lVar13 < 0) || (p->nObjs <= piVar6[uVar12])) goto LAB_001f5776;
          pGVar3 = p->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          if ((int)pGVar3[lVar13].Value < 0) {
LAB_001f57b4:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          Gia_ManAppendCo(p_00,pGVar3[lVar13].Value ^
                               (uint)((ulong)*(undefined8 *)(pGVar3 + lVar13) >> 0x3f));
          uVar12 = uVar12 + 1;
        } while (nNodes != uVar12);
      }
    }
    if (vNodes->pArray != (int *)0x0) {
      free(vNodes->pArray);
      vNodes->pArray = (int *)0x0;
    }
    free(vNodes);
    if (piVar6 != (int *)0x0) {
      free(piVar6);
      __ptr->pArray = (int *)0x0;
    }
    free(__ptr);
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDemiterToDual( Gia_Man_t * p )
{
    Gia_Man_t * pNew; Gia_Obj_t * pObj; int i;
    Vec_Int_t * vNodes;
    Vec_Int_t * vOrder = Gia_ManCollectTopXors( p );
    if ( vOrder == NULL )
    {
        printf( "Cannot demiter because the top-most gate is an AND-gate.\n" );
        return NULL;
    }
    assert( Vec_IntSize(vOrder) % 2 == 0 );
    vNodes = Vec_IntAlloc( Gia_ManObjNum(p) );
    Gia_ManIncrementTravId( p );
    Gia_ManCollectAnds( p, Vec_IntArray(vOrder), Vec_IntSize(vOrder), vNodes, NULL );
    pNew = Gia_ManStart( 1 + Gia_ManCiNum(p) + Vec_IntSize(vNodes) + Vec_IntSize(vOrder) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    pObj = Gia_ManCo(p, 0);
    if ( Gia_ObjFanin0(pObj) == Gia_ManConst0(p) )
    {
        Gia_ManAppendCo( pNew, 0 );
        Gia_ManAppendCo( pNew, Gia_ObjFaninC0(pObj) );
    }
    else
    {
        Gia_ManSetPhase( p );
        Gia_ManForEachObjVec( vOrder, p, pObj, i )
            Gia_ManAppendCo( pNew, Abc_LitNotCond(pObj->Value, pObj->fPhase) );
    }
    Vec_IntFree( vNodes );
    Vec_IntFree( vOrder );
    return pNew;
}